

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

Error asmjit::v1_14::Formatter::formatOperand
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,Operand_ *op)

{
  undefined3 uVar1;
  Error EVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  RegType RVar6;
  ShiftOp shiftOp;
  FormatFlags FVar7;
  StringFormatFlags SVar8;
  
  if ((byte)(arch - k32BitMask) < 2) {
    EVar2 = x86::FormatterInternal::formatOperand(sb,formatFlags,emitter,arch,op);
    return EVar2;
  }
  if ((kThumb_BE < arch) || ((0x38e0U >> (arch & 0x1f) & 1) == 0)) {
    return 4;
  }
  uVar3 = (op->_signature)._bits;
  uVar1 = (undefined3)(uVar3 >> 8);
  switch(uVar3 & 7) {
  case 1:
    uVar5 = 0xffffffff;
    if ((short)uVar3 < 0) {
      uVar5 = uVar3 >> 0x10 & 0xf;
    }
    RVar6 = (byte)uVar3 >> 3;
    EVar2 = arm::FormatterInternal::formatRegister
                      (sb,CONCAT31(uVar1,RVar6),emitter,arch,RVar6,op->_baseId,uVar3 >> 0xc & 7,
                       uVar5);
    break;
  case 2:
    FVar7 = kMachineCode;
    EVar2 = String::_opChar(sb,kAppend,'[');
    if (EVar2 != 0) {
      return EVar2;
    }
    uVar3 = (op->_signature)._bits;
    uVar4 = (ulong)uVar3;
    if ((uVar3 & 0xf8) == 0) {
      if ((uVar3 & 0x1f00) != 0) {
LAB_001280ac:
        EVar2 = String::_opString(sb,kAppend,"<None>",0xffffffffffffffff);
        goto LAB_00128100;
      }
      uVar5 = 0;
      if ((uVar3 & 0xf8) == 0) {
        uVar5 = op->_baseId;
      }
      if (uVar5 != 0 || op->_data[1] != 0) goto LAB_001280ac;
    }
    else {
      if ((uVar3 & 0xf8) == 8) {
        EVar2 = formatLabel(sb,formatFlags,emitter,op->_baseId);
      }
      else {
        if ((uVar3 >> 0xd & 1) != 0) {
          FVar7 = kMachineCode;
          EVar2 = String::_opChar(sb,kAppend,'&');
          if (EVar2 != 0) {
            return EVar2;
          }
          uVar4 = (ulong)(byte)(op->_signature)._bits;
        }
        EVar2 = arm::FormatterInternal::formatRegister
                          (sb,FVar7,emitter,arch,(RegType)(uVar4 >> 3) & kMaxValue,op->_baseId,0,
                           0xffffffff);
      }
LAB_00128100:
      if (EVar2 != 0) {
        return EVar2;
      }
    }
    uVar3 = (op->_signature)._bits;
    if ((uVar3 & 0x3000000) == 0x2000000) {
      EVar2 = String::_opChar(sb,kAppend,']');
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar3 = (op->_signature)._bits;
    }
    if ((uVar3 & 0x1f00) != 0) {
      FVar7 = kMachineCode;
      EVar2 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
      EVar2 = arm::FormatterInternal::formatRegister
                        (sb,FVar7,emitter,arch,(RegType)((op->_signature)._bits >> 8) & kMaxValue,
                         op->_data[0],0,0xffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar3 = (op->_signature)._bits;
    }
    uVar5 = 0;
    if ((uVar3 & 0xf8) == 0) {
      uVar5 = op->_baseId;
    }
    if (uVar5 != 0 || op->_data[1] != 0) {
      EVar2 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar4 = CONCAT44(op->_baseId,op->_data[1]);
      if (((op->_signature)._bits & 0xf8) != 0) {
        uVar4 = (long)(int)op->_data[1];
      }
      if (((formatFlags & kHexOffsets) == kNone) || (uVar4 < 10)) {
        uVar5 = 10;
        SVar8 = kSigned;
      }
      else {
        EVar2 = String::_opString(sb,kAppend,"0x",0xffffffffffffffff);
        if (EVar2 != 0) {
          return EVar2;
        }
        uVar5 = 0x10;
        SVar8 = kNone;
      }
      EVar2 = String::_opNumber(sb,kAppend,uVar4,uVar5,0,SVar8);
      if (EVar2 != 0) {
        return EVar2;
      }
    }
    uVar3 = (op->_signature)._bits;
    if ((uVar3 & 0x7c000) != 0) {
      EVar2 = String::_opChar(sb,kAppend,' ');
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar3 = (op->_signature)._bits;
      if ((uVar3 & 0x3000000) == 0) {
        EVar2 = arm::FormatterInternal::formatShiftOp(sb,uVar3 >> 0x14 & (kSXTW|kROR));
        if (EVar2 != 0) {
          return EVar2;
        }
        uVar3 = (op->_signature)._bits;
      }
      EVar2 = String::_opFormat(sb,kAppend," %u",(ulong)(uVar3 >> 0xe & 0x1f));
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar3 = (op->_signature)._bits;
    }
    if ((uVar3 & 0x3000000) != 0x2000000) {
      EVar2 = String::_opChar(sb,kAppend,']');
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar3 = (op->_signature)._bits;
    }
    if (((uVar3 & 0x3000000) != 0x1000000) || (EVar2 = String::_opChar(sb,kAppend,'!'), EVar2 == 0))
    {
      EVar2 = 0;
    }
    break;
  case 3:
    RVar6 = (byte)uVar3 >> 3;
    EVar2 = arm::FormatterInternal::formatRegisterList
                      (sb,CONCAT31(uVar1,RVar6),emitter,arch,RVar6,op->_baseId);
    return EVar2;
  case 4:
    uVar4 = *(ulong *)op->_data;
    shiftOp = uVar3 >> 0x14 & (kSXTW|kROR);
    if ((shiftOp == kLSL) ||
       ((EVar2 = arm::FormatterInternal::formatShiftOp(sb,shiftOp), EVar2 == 0 &&
        (EVar2 = String::_opChar(sb,kAppend,' '), EVar2 == 0)))) {
      if (((formatFlags & kHexImms) == kNone) || (uVar4 < 10)) {
        uVar5 = 10;
        SVar8 = kSigned;
      }
      else {
        EVar2 = String::_opString(sb,kAppend,"0x",0xffffffffffffffff);
        if (EVar2 != 0) {
          return EVar2;
        }
        uVar5 = 0x10;
        SVar8 = kNone;
      }
      EVar2 = String::_opNumber(sb,kAppend,uVar4,uVar5,0,SVar8);
      return EVar2;
    }
    break;
  case 5:
    EVar2 = formatLabel(sb,formatFlags,emitter,op->_baseId);
    return EVar2;
  default:
    EVar2 = String::_opString(sb,kAppend,"<None>",0xffffffffffffffff);
    return EVar2;
  }
  return EVar2;
}

Assistant:

Error formatOperand(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  Arch arch,
  const Operand_& op) noexcept {

#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::FormatterInternal::formatOperand(sb, formatFlags, emitter, arch, op);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyARM(arch))
    return arm::FormatterInternal::formatOperand(sb, formatFlags, emitter, arch, op);
#endif

  return kErrorInvalidArch;
}